

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  uint uVar1;
  ImGuiTabItem *pIVar2;
  ImGuiWindow *pIVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ImGuiTabItem *__src;
  int iVar8;
  ImGuiID IVar9;
  ImGuiTabItemFlags IVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ImGuiTabItem *__dest;
  long lVar16;
  ImGuiTabItem *pIVar17;
  ImGuiTabItem *tab;
  ImGuiTabItem item_tmp;
  undefined3 uStack_3b;
  undefined5 local_38;
  undefined3 uStack_33;
  undefined5 uStack_30;
  
  if (tab_bar->ReorderRequestTabId == 0) {
    return false;
  }
  lVar15 = (long)(tab_bar->Tabs).Size;
  if (0 < lVar15) {
    pIVar2 = (tab_bar->Tabs).Data;
    lVar16 = 0;
    tab = pIVar2;
    do {
      if (tab->ID == tab_bar->ReorderRequestTabId) {
        if ((tab->Flags & 0x20) != 0) {
          return false;
        }
        iVar11 = ImGuiTabBar::GetTabOrder(tab_bar,tab);
        iVar14 = (int)tab_bar->ReorderRequestOffset;
        uVar12 = iVar11 + iVar14;
        if ((int)uVar12 < 0) {
          return false;
        }
        if ((tab_bar->Tabs).Size <= (int)uVar12) {
          return false;
        }
        pIVar17 = (tab_bar->Tabs).Data;
        uVar1 = pIVar17[uVar12].Flags;
        if ((uVar1 & 0x20) != 0) {
          return false;
        }
        if (((uVar1 ^ tab->Flags) & 0xc0) != 0) {
          return false;
        }
        pIVar17 = pIVar17 + uVar12;
        IVar9 = tab->ID;
        IVar10 = tab->Flags;
        pIVar3 = tab->Window;
        iVar11 = tab->LastFrameVisible;
        iVar8 = tab->LastFrameSelected;
        uVar4 = tab->Offset;
        uVar5 = tab->Width;
        uVar6._0_4_ = tab->ContentWidth;
        uVar6._4_4_ = tab->NameOffset;
        uVar7._0_2_ = tab->BeginOrder;
        uVar7._2_2_ = tab->IndexDuringLayout;
        uVar7._4_1_ = tab->WantClose;
        uVar7._5_3_ = *(undefined3 *)&tab->field_0x2d;
        local_38 = (undefined5)uVar6;
        uStack_33 = (undefined3)((uint)uVar6._4_4_ >> 8);
        uStack_30 = (undefined5)uVar7;
        uStack_3b = (undefined3)((uint)uVar5 >> 8);
        __dest = pIVar17 + 1;
        __src = pIVar17;
        if (0 < tab_bar->ReorderRequestOffset) {
          __dest = tab;
          __src = (ImGuiTabItem *)((long)pIVar2 + (0x30 - lVar16));
        }
        iVar13 = -iVar14;
        if (0 < iVar14) {
          iVar13 = iVar14;
        }
        memmove(__dest,__src,(ulong)(uint)(iVar13 << 4) * 3);
        *(ulong *)((long)&pIVar17->Width + 1) = CONCAT53(local_38,uStack_3b);
        *(ulong *)((long)&pIVar17->NameOffset + 1) = CONCAT53(uStack_30,uStack_33);
        pIVar17->LastFrameVisible = iVar11;
        pIVar17->LastFrameSelected = iVar8;
        pIVar17->Offset = (float)uVar4;
        pIVar17->Width = (float)uVar5;
        pIVar17->ID = IVar9;
        pIVar17->Flags = IVar10;
        pIVar17->Window = pIVar3;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
      lVar16 = lVar16 + -0x30;
      tab = tab + 1;
    } while (lVar15 * 0x30 + lVar16 != 0);
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}